

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

void helper_rfdi_ppc64(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  do_rfi(env,env->spr[0x23e],env->spr[0x23f]);
  return;
}

Assistant:

void helper_rfdi(CPUPPCState *env)
{
    /* FIXME: choose CSRR1 or DSRR1 based on cpu type */
    do_rfi(env, env->spr[SPR_BOOKE_DSRR0], env->spr[SPR_BOOKE_DSRR1]);
}